

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall
trieste::PassDef::PassDef
          (PassDef *this,string *name,Wellformed *wf,flag direction,
          initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
          *r)

{
  initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
  __l;
  allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
  local_49;
  iterator local_48;
  size_type sStack_40;
  initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
  *local_30;
  initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
  *r_local;
  Wellformed *pWStack_20;
  flag direction_local;
  Wellformed *wf_local;
  string *name_local;
  PassDef *this_local;
  
  local_30 = r;
  r_local._4_4_ = direction;
  pWStack_20 = wf;
  wf_local = (Wellformed *)name;
  name_local = &this->name_;
  std::__cxx11::string::string((string *)this,name);
  this->wf_ = pWStack_20;
  this->direction_ = r_local._4_4_;
  local_48 = local_30->_M_array;
  sStack_40 = local_30->_M_len;
  std::
  allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
  ::allocator(&local_49);
  __l._M_len = sStack_40;
  __l._M_array = local_48;
  std::
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  ::vector((vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
            *)&this->rules_,__l,&local_49);
  std::
  allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
  ::~allocator(&local_49);
  detail::
  DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
  ::DefaultMap(&this->rule_map);
  std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::function
            ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)&this->pre_once);
  std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::function
            ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)&this->post_once);
  std::
  map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
  ::map((map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
         *)&this->pre_);
  std::
  map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
  ::map((map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
         *)&this->post_);
  compile_rules(this);
  return;
}

Assistant:

PassDef(
      const std::string& name,
      const wf::Wellformed& wf,
      dir::flag direction,
      const std::initializer_list<detail::PatternEffect<Node>>& r)
    : name_(name), wf_(wf), direction_(direction), rules_(r)
    {
      compile_rules();
    }